

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  char *pcVar1;
  char *name_00;
  bool bVar2;
  cmVariableWatch *this_00;
  cmVariableWatch *vv;
  allocator local_41;
  string local_40;
  char *local_20;
  char *value_local;
  string *name_local;
  cmMakefile *this_local;
  
  if (value != (char *)0x0) {
    local_20 = value;
    value_local = (char *)name;
    name_local = (string *)this;
    bVar2 = VariableInitialized(this,name);
    if (bVar2) {
      LogUnused(this,"changing definition",(string *)value_local);
    }
    name_00 = value_local;
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    cmState::Snapshot::SetDefinition(&this->StateSnapshot,(string *)name_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_00 = GetVariableWatch(this);
    if (this_00 != (cmVariableWatch *)0x0) {
      cmVariableWatch::VariableAccessed(this_00,(string *)value_local,3,local_20,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value )
    {
    return;
    }

  if (this->VariableInitialized(name))
    {
    this->LogUnused("changing definition", name);
    }
  this->StateSnapshot.SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name,
                         cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value,
                         this);
    }
#endif
}